

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fseek.c
# Opt level: O3

int fseek(FILE *__stream,long __off,int __whence)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  uVar2 = *(uint *)((long)&__stream->_IO_buf_end + 4);
  if ((uVar2 & 0x10) != 0) {
    iVar1 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream);
    if (iVar1 == -1) {
      iVar1 = -1;
      goto LAB_001078d4;
    }
    uVar2 = *(uint *)((long)&__stream->_IO_buf_end + 4);
  }
  uVar4 = 0xfffffbe7;
  if ((uVar2 & 0x40) == 0) {
    uVar4 = 0xfffffbff;
  }
  *(uint *)((long)&__stream->_IO_buf_end + 4) = uVar4 & uVar2;
  if (__whence == 1) {
    __off = __off - (long)(__stream->_IO_buf_base +
                          (*(int *)&__stream->_IO_write_base - *(int *)&__stream->_IO_read_base));
  }
  lVar3 = _PDCLIB_seek((_PDCLIB_file_t *)__stream,__off,__whence);
  iVar1 = -(uint)(lVar3 == -1);
LAB_001078d4:
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return iVar1;
}

Assistant:

int fseek( struct _PDCLIB_file_t * stream, long offset, int whence )
{
    int rc;
    _PDCLIB_LOCK( stream->mtx );

    if ( stream->status & _PDCLIB_FWRITE )
    {
        if ( _PDCLIB_flushbuffer( stream ) == EOF )
        {
            _PDCLIB_UNLOCK( stream->mtx );
            return EOF;
        }
    }

    stream->status &= ~ _PDCLIB_EOFFLAG;

    if ( stream->status & _PDCLIB_FRW )
    {
        stream->status &= ~( _PDCLIB_FREAD | _PDCLIB_FWRITE );
    }

    if ( whence == SEEK_CUR )
    {
        offset -= ( ( ( int )stream->bufend - ( int )stream->bufidx ) + stream->ungetidx );
    }

    rc = ( _PDCLIB_seek( stream, offset, whence ) != EOF ) ? 0 : EOF;
    _PDCLIB_UNLOCK( stream->mtx );
    return rc;
}